

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O0

void __thiscall
boost::wrapexcept<boost::xpressive::regex_error>::wrapexcept
          (wrapexcept<boost::xpressive::regex_error> *this,regex_error *e,source_location *loc)

{
  uint_least32_t uVar1;
  char *pcVar2;
  source_location *in_RDX;
  wrapexcept<boost::xpressive::regex_error> *in_RSI;
  regex_error *in_RDI;
  exception *in_stack_ffffffffffffff98;
  regex_error *in_stack_ffffffffffffffa8;
  error_info<boost::throw_column_,_int> local_44;
  error_info<boost::throw_function_,_const_char_*> local_40;
  error_info<boost::throw_line_,_int> local_34;
  error_info<boost::throw_file_,_const_char_*> local_30 [3];
  source_location *local_18;
  wrapexcept<boost::xpressive::regex_error> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  exception_detail::clone_base::clone_base((clone_base *)in_RDI);
  xpressive::regex_error::regex_error(in_RDI,in_stack_ffffffffffffffa8);
  *(undefined ***)in_RDI = &PTR_clone_0021b1e0;
  *(undefined ***)&in_RDI->field_0x8 = &PTR__wrapexcept_0021b210;
  (in_RDI->super_exception).data_.px_ = (error_info_container *)&PTR__wrapexcept_0021b238;
  copy_from(local_10,in_stack_ffffffffffffff98);
  pcVar2 = source_location::file_name(local_18);
  error_info<boost::throw_file_,_const_char_*>::error_info(local_30,pcVar2);
  exception_detail::
  set_info<boost::wrapexcept<boost::xpressive::regex_error>,boost::throw_file_,char_const*>
            (local_10,(error_info<boost::throw_file_,_const_char_*> *)in_stack_ffffffffffffff98);
  uVar1 = source_location::line(local_18);
  error_info<boost::throw_line_,_int>::error_info(&local_34,uVar1);
  exception_detail::
  set_info<boost::wrapexcept<boost::xpressive::regex_error>,boost::throw_line_,int>
            (local_10,(error_info<boost::throw_line_,_int> *)in_stack_ffffffffffffff98);
  pcVar2 = source_location::function_name(local_18);
  error_info<boost::throw_function_,_const_char_*>::error_info(&local_40,pcVar2);
  exception_detail::
  set_info<boost::wrapexcept<boost::xpressive::regex_error>,boost::throw_function_,char_const*>
            (local_10,(error_info<boost::throw_function_,_const_char_*> *)in_stack_ffffffffffffff98)
  ;
  uVar1 = source_location::column(local_18);
  error_info<boost::throw_column_,_int>::error_info(&local_44,uVar1);
  exception_detail::
  set_info<boost::wrapexcept<boost::xpressive::regex_error>,boost::throw_column_,int>
            (local_10,(error_info<boost::throw_column_,_int> *)in_stack_ffffffffffffff98);
  return;
}

Assistant:

explicit wrapexcept( E const & e, boost::source_location const & loc ): E( e )
    {
        copy_from( &e );

        set_info( *this, throw_file( loc.file_name() ) );
        set_info( *this, throw_line( static_cast<int>( loc.line() ) ) );
        set_info( *this, throw_function( loc.function_name() ) );
        set_info( *this, throw_column( static_cast<int>( loc.column() ) ) );
    }